

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::dotted_key(spec *s)

{
  sequence *in_RDI;
  sequence *in_stack_ffffffffffffff50;
  either *in_stack_ffffffffffffff58;
  sequence *in_stack_ffffffffffffff60;
  spec *in_stack_ffffffffffffff88;
  spec *in_stack_ffffffffffffff98;
  
  simple_key(in_stack_ffffffffffffff88);
  dot_sep(in_stack_ffffffffffffff98);
  simple_key(in_stack_ffffffffffffff88);
  sequence::sequence<toml::detail::sequence,toml::detail::either>
            (in_stack_ffffffffffffff60,(sequence *)in_stack_ffffffffffffff58,
             (either *)in_stack_ffffffffffffff50);
  repeat_at_least::repeat_at_least<toml::detail::sequence>
            ((repeat_at_least *)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50);
  sequence::sequence<toml::detail::either,toml::detail::repeat_at_least>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (repeat_at_least *)in_stack_ffffffffffffff50);
  repeat_at_least::~repeat_at_least((repeat_at_least *)in_RDI);
  sequence::~sequence(in_RDI);
  either::~either((either *)in_RDI);
  sequence::~sequence(in_RDI);
  either::~either((either *)in_RDI);
  return in_RDI;
}

Assistant:

TOML11_INLINE sequence dotted_key(const spec& s)
{
    return sequence(
        simple_key(s),
        repeat_at_least(1, sequence(dot_sep(s), simple_key(s)))
    );
}